

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH_errorcode
XXH3_update(XXH3_state_t *state,xxh_u8 *input,size_t len,XXH3_f_accumulate_512 f_acc512,
           XXH3_f_scrambleAcc f_scramble)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  XXH3_f_accumulate_512 unaff_RBX;
  xxh_u8 *pxVar8;
  ulong uVar9;
  XXH3_f_scrambleAcc unaff_R12;
  uchar *secret;
  ulong __n;
  xxh_u8 *input_00;
  
  if (input != (xxh_u8 *)0x0) {
    secret = state->customSecret;
    if (state->extSecret != (uchar *)0x0) {
      secret = state->extSecret;
    }
    state->totalLen = state->totalLen + len;
    uVar9 = (ulong)state->bufferedSize;
    if (uVar9 + len < 0x101) {
      memcpy(state->buffer + uVar9,input,len);
      uVar9 = (ulong)((int)len + state->bufferedSize);
    }
    else {
      pxVar8 = input + len;
      if (uVar9 != 0) {
        __n = (ulong)(0x100 - state->bufferedSize);
        memcpy(state->buffer + uVar9,input,__n);
        input = input + __n;
        XXH3_consumeStripes(state->acc,&state->nbStripesSoFar,state->nbStripesPerBlock,state->buffer
                            ,4,secret,state->secretLimit,unaff_RBX,unaff_R12);
        state->bufferedSize = 0;
      }
      if (input + 0x100 < pxVar8) {
        do {
          input_00 = input;
          XXH3_consumeStripes(state->acc,&state->nbStripesSoFar,state->nbStripesPerBlock,input_00,4,
                              secret,state->secretLimit,unaff_RBX,unaff_R12);
          input = input_00 + 0x100;
        } while (input < pxVar8 + -0x100);
        uVar1 = *(undefined8 *)(input_00 + 0xc0);
        uVar2 = *(undefined8 *)(input_00 + 200);
        uVar3 = *(undefined8 *)(input_00 + 0xd0);
        uVar4 = *(undefined8 *)(input_00 + 0xd8);
        uVar5 = *(undefined8 *)(input_00 + 0xe0);
        uVar6 = *(undefined8 *)(input_00 + 0xe8);
        uVar7 = *(undefined8 *)(input_00 + 0xf8);
        *(undefined8 *)(state->buffer + 0xf0) = *(undefined8 *)(input_00 + 0xf0);
        *(undefined8 *)(state->buffer + 0xf8) = uVar7;
        *(undefined8 *)(state->buffer + 0xe0) = uVar5;
        *(undefined8 *)(state->buffer + 0xe8) = uVar6;
        *(undefined8 *)(state->buffer + 0xd0) = uVar3;
        *(undefined8 *)(state->buffer + 0xd8) = uVar4;
        *(undefined8 *)(state->buffer + 0xc0) = uVar1;
        *(undefined8 *)(state->buffer + 200) = uVar2;
      }
      uVar9 = (long)pxVar8 - (long)input;
      memcpy(state->buffer,input,uVar9);
    }
    state->bufferedSize = (XXH32_hash_t)uVar9;
    return XXH_OK;
  }
  return XXH_ERROR;
}

Assistant:

XXH_FORCE_INLINE XXH_errorcode XXH3_update(XXH3_state_t* state,
                                           const xxh_u8* input, size_t len,
                                           XXH3_f_accumulate_512 f_acc512,
                                           XXH3_f_scrambleAcc f_scramble) {
  if (input == NULL)
#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && \
    (XXH_ACCEPT_NULL_INPUT_POINTER >= 1)
    return XXH_OK;
#else
    return XXH_ERROR;
#endif

  {
    const xxh_u8* const bEnd = input + len;
    const unsigned char* const secret =
        (state->extSecret == NULL) ? state->customSecret : state->extSecret;

    state->totalLen += len;
    XXH_ASSERT(state->bufferedSize <= XXH3_INTERNALBUFFER_SIZE);

    if (state->bufferedSize + len <=
        XXH3_INTERNALBUFFER_SIZE) { /* fill in tmp buffer */
      XXH_memcpy(state->buffer + state->bufferedSize, input, len);
      state->bufferedSize += (XXH32_hash_t)len;
      return XXH_OK;
    }
    /* total input is now > XXH3_INTERNALBUFFER_SIZE */

#define XXH3_INTERNALBUFFER_STRIPES (XXH3_INTERNALBUFFER_SIZE / XXH_STRIPE_LEN)
    XXH_STATIC_ASSERT(XXH3_INTERNALBUFFER_SIZE % XXH_STRIPE_LEN ==
                      0); /* clean multiple */

    /*
     * Internal buffer is partially filled (always, except at beginning)
     * Complete it, then consume it.
     */
    if (state->bufferedSize) {
      size_t const loadSize = XXH3_INTERNALBUFFER_SIZE - state->bufferedSize;
      XXH_memcpy(state->buffer + state->bufferedSize, input, loadSize);
      input += loadSize;
      XXH3_consumeStripes(state->acc, &state->nbStripesSoFar,
                          state->nbStripesPerBlock, state->buffer,
                          XXH3_INTERNALBUFFER_STRIPES, secret,
                          state->secretLimit, f_acc512, f_scramble);
      state->bufferedSize = 0;
    }
    XXH_ASSERT(input < bEnd);

    /* Consume input by a multiple of internal buffer size */
    if (input + XXH3_INTERNALBUFFER_SIZE < bEnd) {
      const xxh_u8* const limit = bEnd - XXH3_INTERNALBUFFER_SIZE;
      do {
        XXH3_consumeStripes(state->acc, &state->nbStripesSoFar,
                            state->nbStripesPerBlock, input,
                            XXH3_INTERNALBUFFER_STRIPES, secret,
                            state->secretLimit, f_acc512, f_scramble);
        input += XXH3_INTERNALBUFFER_SIZE;
      } while (input < limit);
      /* for last partial stripe */
      memcpy(state->buffer + sizeof(state->buffer) - XXH_STRIPE_LEN,
             input - XXH_STRIPE_LEN, XXH_STRIPE_LEN);
    }
    XXH_ASSERT(input < bEnd);

    /* Some remaining input (always) : buffer it */
    XXH_memcpy(state->buffer, input, (size_t)(bEnd - input));
    state->bufferedSize = (XXH32_hash_t)(bEnd - input);
  }

  return XXH_OK;
}